

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O0

size_t google::protobuf::internal::MapValueRefDataOnlyByteSize
                 (FieldDescriptor *field,MapValueConstRef *value)

{
  Type TVar1;
  uint32_t value_00;
  int32_t iVar2;
  int value_01;
  uint64_t value_02;
  int64_t iVar3;
  Message *value_03;
  LogMessage *pLVar4;
  string_view value_04;
  string_view value_05;
  LogMessage local_80;
  Voidify local_69;
  string_view local_68;
  string_view local_58;
  LogMessage local_38;
  Voidify local_21;
  MapValueConstRef *local_20;
  MapValueConstRef *value_local;
  FieldDescriptor *field_local;
  
  local_20 = value;
  value_local = (MapValueConstRef *)field;
  TVar1 = FieldDescriptor::type(field);
  switch(TVar1) {
  case TYPE_DOUBLE:
    field_local = (FieldDescriptor *)0x8;
    break;
  case TYPE_FLOAT:
    field_local = (FieldDescriptor *)0x4;
    break;
  case TYPE_INT64:
    iVar3 = MapValueConstRef::GetInt64Value(local_20);
    field_local = (FieldDescriptor *)WireFormatLite::Int64Size(iVar3);
    break;
  case TYPE_UINT64:
    value_02 = MapValueConstRef::GetUInt64Value(local_20);
    field_local = (FieldDescriptor *)WireFormatLite::UInt64Size(value_02);
    break;
  case TYPE_INT32:
    iVar2 = MapValueConstRef::GetInt32Value(local_20);
    field_local = (FieldDescriptor *)WireFormatLite::Int32Size(iVar2);
    break;
  case TYPE_FIXED64:
    field_local = (FieldDescriptor *)0x8;
    break;
  case TYPE_FIXED32:
    field_local = (FieldDescriptor *)0x4;
    break;
  case TYPE_BOOL:
    field_local = (FieldDescriptor *)0x1;
    break;
  case TYPE_STRING:
    local_58 = MapValueConstRef::GetStringValue(local_20);
    value_04._M_str = local_58._M_str;
    value_04._M_len = (size_t)value_04._M_str;
    field_local = (FieldDescriptor *)
                  WireFormatLite::StringSize((WireFormatLite *)local_58._M_len,value_04);
    break;
  case TYPE_GROUP:
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_38,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format.cc"
               ,0x62a);
    pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_38);
    pLVar4 = absl::lts_20250127::log_internal::LogMessage::operator<<
                       (pLVar4,(char (*) [12])"Unsupported");
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_21,pLVar4);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_38);
  case TYPE_MESSAGE:
    value_03 = MapValueConstRef::GetMessageValue(local_20);
    field_local = (FieldDescriptor *)
                  WireFormatLite::MessageSize<google::protobuf::Message>(value_03);
    break;
  case TYPE_BYTES:
    local_68 = MapValueConstRef::GetStringValue(local_20);
    value_05._M_str = local_68._M_str;
    value_05._M_len = (size_t)value_05._M_str;
    field_local = (FieldDescriptor *)
                  WireFormatLite::BytesSize((WireFormatLite *)local_68._M_len,value_05);
    break;
  case TYPE_UINT32:
    value_00 = MapValueConstRef::GetUInt32Value(local_20);
    field_local = (FieldDescriptor *)WireFormatLite::UInt32Size(value_00);
    break;
  case TYPE_ENUM:
    value_01 = MapValueConstRef::GetEnumValue(local_20);
    field_local = (FieldDescriptor *)WireFormatLite::EnumSize(value_01);
    break;
  case TYPE_SFIXED32:
    field_local = (FieldDescriptor *)0x4;
    break;
  case TYPE_SFIXED64:
    field_local = (FieldDescriptor *)0x8;
    break;
  case TYPE_SINT32:
    iVar2 = MapValueConstRef::GetInt32Value(local_20);
    field_local = (FieldDescriptor *)WireFormatLite::SInt32Size(iVar2);
    break;
  case MAX_TYPE:
    iVar3 = MapValueConstRef::GetInt64Value(local_20);
    field_local = (FieldDescriptor *)WireFormatLite::SInt64Size(iVar3);
    break;
  default:
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_80,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format.cc"
               ,0x64a);
    pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_80);
    pLVar4 = absl::lts_20250127::log_internal::LogMessage::operator<<
                       (pLVar4,(char (*) [16])"Cannot get here");
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_69,pLVar4);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_80);
  }
  return (size_t)field_local;
}

Assistant:

static size_t MapValueRefDataOnlyByteSize(const FieldDescriptor* field,
                                          const MapValueConstRef& value) {
  switch (field->type()) {
    case FieldDescriptor::TYPE_GROUP:
      ABSL_LOG(FATAL) << "Unsupported";
      return 0;
#define CASE_TYPE(FieldType, CamelFieldType, CamelCppType) \
  case FieldDescriptor::TYPE_##FieldType:                  \
    return WireFormatLite::CamelFieldType##Size(           \
        value.Get##CamelCppType##Value());

#define FIXED_CASE_TYPE(FieldType, CamelFieldType) \
  case FieldDescriptor::TYPE_##FieldType:          \
    return WireFormatLite::k##CamelFieldType##Size;

      CASE_TYPE(INT32, Int32, Int32);
      CASE_TYPE(INT64, Int64, Int64);
      CASE_TYPE(UINT32, UInt32, UInt32);
      CASE_TYPE(UINT64, UInt64, UInt64);
      CASE_TYPE(SINT32, SInt32, Int32);
      CASE_TYPE(SINT64, SInt64, Int64);
      CASE_TYPE(STRING, String, String);
      CASE_TYPE(BYTES, Bytes, String);
      CASE_TYPE(ENUM, Enum, Enum);
      CASE_TYPE(MESSAGE, Message, Message);
      FIXED_CASE_TYPE(FIXED32, Fixed32);
      FIXED_CASE_TYPE(FIXED64, Fixed64);
      FIXED_CASE_TYPE(SFIXED32, SFixed32);
      FIXED_CASE_TYPE(SFIXED64, SFixed64);
      FIXED_CASE_TYPE(DOUBLE, Double);
      FIXED_CASE_TYPE(FLOAT, Float);
      FIXED_CASE_TYPE(BOOL, Bool);

#undef CASE_TYPE
#undef FIXED_CASE_TYPE
  }
  ABSL_LOG(FATAL) << "Cannot get here";
  return 0;
}